

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  wchar_t *pwVar1;
  wchar_t *in_RDI;
  archive_mstring *unaff_retaddr;
  unsigned_long *in_stack_00000020;
  unsigned_long *in_stack_00000028;
  wchar_t *in_stack_00000030;
  
  archive_mstring_copy_wcs(unaff_retaddr,in_RDI);
  pwVar1 = ae_wcstofflags(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  return pwVar1;
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}